

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultCollisionConfiguration.cpp
# Opt level: O0

btCollisionAlgorithmCreateFunc * __thiscall
btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc
          (btDefaultCollisionConfiguration *this,int proxyType0,int proxyType1)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btCollisionAlgorithmCreateFunc *local_8;
  
  if ((in_ESI == 8) && (in_EDX == 8)) {
    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x78);
  }
  else if ((in_ESI == 8) && (in_EDX == 1)) {
    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x98);
  }
  else if ((in_ESI == 1) && (in_EDX == 8)) {
    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xa0);
  }
  else if ((in_ESI == 0) && (in_EDX == 0)) {
    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x90);
  }
  else {
    bVar1 = btBroadphaseProxy::isConvex(in_ESI);
    if ((bVar1) && (in_EDX == 0x1c)) {
      local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xb0);
    }
    else {
      bVar1 = btBroadphaseProxy::isConvex(in_EDX);
      if ((bVar1) && (in_ESI == 0x1c)) {
        local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xa8);
      }
      else {
        bVar1 = btBroadphaseProxy::isConvex(in_ESI);
        if ((bVar1) && (bVar1 = btBroadphaseProxy::isConvex(in_EDX), bVar1)) {
          local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x40);
        }
        else {
          bVar1 = btBroadphaseProxy::isConvex(in_ESI);
          if ((bVar1) && (bVar1 = btBroadphaseProxy::isConcave(in_EDX), bVar1)) {
            local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x48);
          }
          else {
            bVar1 = btBroadphaseProxy::isConvex(in_EDX);
            if ((bVar1) && (bVar1 = btBroadphaseProxy::isConcave(in_ESI), bVar1)) {
              local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x50);
            }
            else {
              bVar1 = btBroadphaseProxy::isCompound(in_ESI);
              if ((bVar1) && (bVar1 = btBroadphaseProxy::isCompound(in_EDX), bVar1)) {
                local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x60);
              }
              else {
                bVar1 = btBroadphaseProxy::isCompound(in_ESI);
                if (bVar1) {
                  local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x58);
                }
                else {
                  bVar1 = btBroadphaseProxy::isCompound(in_EDX);
                  if (bVar1) {
                    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x68);
                  }
                  else {
                    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0x70);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

btCollisionAlgorithmCreateFunc* btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc(int proxyType0,int proxyType1)
{



	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1==SPHERE_SHAPE_PROXYTYPE))
	{
		return	m_sphereSphereCF;
	}
#ifdef USE_BUGGY_SPHERE_BOX_ALGORITHM
	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1==BOX_SHAPE_PROXYTYPE))
	{
		return	m_sphereBoxCF;
	}

	if ((proxyType0 == BOX_SHAPE_PROXYTYPE ) && (proxyType1==SPHERE_SHAPE_PROXYTYPE))
	{
		return	m_boxSphereCF;
	}
#endif //USE_BUGGY_SPHERE_BOX_ALGORITHM


	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE ) && (proxyType1==TRIANGLE_SHAPE_PROXYTYPE))
	{
		return	m_sphereTriangleCF;
	}

	if ((proxyType0 == TRIANGLE_SHAPE_PROXYTYPE  ) && (proxyType1==SPHERE_SHAPE_PROXYTYPE))
	{
		return	m_triangleSphereCF;
	} 

	if ((proxyType0 == BOX_SHAPE_PROXYTYPE) && (proxyType1 == BOX_SHAPE_PROXYTYPE))
	{
		return m_boxBoxCF;
	}
	
	if (btBroadphaseProxy::isConvex(proxyType0) && (proxyType1 == STATIC_PLANE_PROXYTYPE))
	{
		return m_convexPlaneCF;
	}

	if (btBroadphaseProxy::isConvex(proxyType1) && (proxyType0 == STATIC_PLANE_PROXYTYPE))
	{
		return m_planeConvexCF;
	}
	


	if (btBroadphaseProxy::isConvex(proxyType0) && btBroadphaseProxy::isConvex(proxyType1))
	{
		return m_convexConvexCreateFunc;
	}

	if (btBroadphaseProxy::isConvex(proxyType0) && btBroadphaseProxy::isConcave(proxyType1))
	{
		return m_convexConcaveCreateFunc;
	}

	if (btBroadphaseProxy::isConvex(proxyType1) && btBroadphaseProxy::isConcave(proxyType0))
	{
		return m_swappedConvexConcaveCreateFunc;
	}


	if (btBroadphaseProxy::isCompound(proxyType0) && btBroadphaseProxy::isCompound(proxyType1))
	{
		return m_compoundCompoundCreateFunc;
	}

	if (btBroadphaseProxy::isCompound(proxyType0))
	{
		return m_compoundCreateFunc;
	} else
	{
		if (btBroadphaseProxy::isCompound(proxyType1))
		{
			return m_swappedCompoundCreateFunc;
		}
	}

	//failed to find an algorithm
	return m_emptyCreateFunc;
}